

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# commands.h
# Opt level: O2

int __thiscall
CCommandManager::Filter
          (CCommandManager *this,array<bool,_allocator_default<bool>_> *aFilter,char *pStr,
          bool Exact)

{
  bool *pbVar1;
  uint uVar2;
  int iVar3;
  char *pcVar4;
  ulong uVar5;
  int i;
  long lVar6;
  uint uVar7;
  long lVar8;
  bool bVar9;
  
  dbg_assert_imp("/workspace/llm4binary/github/license_all_cmakelists_1510/TsFreddie[P]teeworlds/src/game/commands.h"
                 ,0x94,(uint)(aFilter->num_elements == (this->m_aCommands).num_elements),
                 "filter size must match command count");
  if (*pStr == '\0') {
    pbVar1 = aFilter->list;
    uVar7 = 0;
    uVar2 = aFilter->num_elements;
    if (aFilter->num_elements < 1) {
      uVar2 = uVar7;
    }
    for (uVar5 = 0; uVar2 != uVar5; uVar5 = uVar5 + 1) {
      pbVar1[uVar5] = false;
    }
  }
  else {
    lVar8 = 0;
    if (Exact) {
      uVar7 = 0;
      for (lVar6 = 0; lVar6 < (this->m_aCommands).num_elements; lVar6 = lVar6 + 1) {
        iVar3 = str_comp(((this->m_aCommands).list)->m_aName + lVar8,pStr);
        aFilter->list[lVar6] = iVar3 != 0;
        uVar7 = uVar7 + (iVar3 != 0);
        lVar8 = lVar8 + 0xa0;
      }
    }
    else {
      uVar7 = 0;
      for (lVar6 = 0; lVar6 < (this->m_aCommands).num_elements; lVar6 = lVar6 + 1) {
        pcVar4 = str_find_nocase(((this->m_aCommands).list)->m_aName + lVar8,pStr);
        bVar9 = ((this->m_aCommands).list)->m_aName + lVar8 != pcVar4;
        aFilter->list[lVar6] = bVar9;
        uVar7 = uVar7 + bVar9;
        lVar8 = lVar8 + 0xa0;
      }
    }
  }
  return uVar7;
}

Assistant:

int Filter(array<bool> &aFilter, const char *pStr, bool Exact)
    {
        dbg_assert(aFilter.size() == m_aCommands.size(), "filter size must match command count");
        if(!*pStr)
        {
            for(int i = 0; i < aFilter.size(); i++)
                aFilter[i] = false;
            return 0;
        }

        int Filtered = 0;
        if(Exact)
        {
            for(int i = 0; i < m_aCommands.size(); i++)
                Filtered += (aFilter[i] = str_comp(m_aCommands[i].m_aName, pStr));
        }
        else
        {
            for(int i = 0; i < m_aCommands.size(); i++)
                Filtered += (aFilter[i] = str_find_nocase(m_aCommands[i].m_aName, pStr) != m_aCommands[i].m_aName);
        }

        return Filtered;
    }